

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_match_bstr(uint8_t *pBegin,uint8_t *pEnd,uint8_t *pStrBegin,uint8_t *pStrEnd)

{
  int *piVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  
  if (pStrEnd < pStrBegin || pEnd < pBegin) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
LAB_00139733:
    pBegin = (uint8_t *)0x0;
  }
  else {
    puVar3 = pBegin;
    puVar4 = pStrBegin;
    if (pBegin < pEnd) {
      lVar2 = (long)pStrEnd - (long)pStrBegin;
      puVar4 = pStrBegin + ((long)pEnd - (long)pBegin);
      puVar5 = pBegin;
      do {
        if (pStrEnd <= pStrBegin) {
          return pBegin + lVar2;
        }
        if (*puVar5 != *pStrBegin) goto LAB_00139733;
        puVar5 = puVar5 + 1;
        pStrBegin = pStrBegin + 1;
        puVar3 = pEnd;
      } while (puVar5 != pEnd);
    }
    if (puVar4 == pStrEnd) {
      pBegin = puVar3;
    }
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_match_bstr(const uint8_t *pBegin, const uint8_t *pEnd, const uint8_t *pStrBegin, const uint8_t *pStrEnd)
{
   const uint8_t *pNext = pBegin;
   const uint8_t *pStrNext = pStrBegin;
   if ( (pBegin > pEnd) || (pStrBegin > pStrEnd) )
   {
      errno = EINVAL; //invalid arguments
      return 0;
   }
   while(pNext < pEnd){
      if (pStrNext < pStrEnd)
      {
         if (*pNext != *pStrNext)
         {
            return 0; //string did not match
         }
      }
      else
      {
         //All characters in pStr has been successfully matched
         return pNext; //pNext should point to pStrEnd at this point
      }
      pNext++;
      pStrNext++;
   }
   if (pStrNext == pStrEnd)
   {
      return pNext; //All characters in pStr has been successfully matched
   }
   return pBegin; //reached pEnd before pStr was fully matched
}